

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O3

bool cmProjectCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  PolicyStatus PVar5;
  int iVar6;
  undefined8 *puVar7;
  string *psVar8;
  cmValue cVar9;
  undefined8 uVar10;
  cmMakefile *pcVar11;
  long *plVar12;
  pointer pcVar13;
  cmMakefile *pcVar14;
  PolicyID extraout_EDX;
  char *pcVar15;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id;
  undefined1 *puVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  pointer pbVar20;
  _Alloc_hider _Var21;
  ulong uVar22;
  _Base_ptr p_Var23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  string *psVar25;
  string *i;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view separator;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view value_10;
  string_view value_11;
  string_view value_12;
  string_view value_13;
  string_view value_14;
  string_view value_15;
  uint v [4];
  string msg;
  RegularExpression vx;
  string version_string;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  version_components;
  string homepage;
  string description;
  string version;
  undefined1 local_338 [40];
  string *local_310;
  _Any_data local_308;
  cmMakefile *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2f0;
  string local_2e8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [16];
  pointer local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [16];
  __node_base local_218;
  _Hash_node_base local_208 [2];
  __node_base *local_1f8;
  int local_1f0;
  __node_base local_1e8 [2];
  _Base_ptr local_1d8 [2];
  undefined1 local_1c8 [16];
  _Base_ptr local_1b8;
  undefined1 local_1a8 [16];
  _Base_ptr local_198 [2];
  undefined1 local_188 [24];
  cmMakefile *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  undefined8 uStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  pointer local_a8;
  pointer local_a0;
  cmExecutionStatus *local_98;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_2b8._0_8_ = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,"PROJECT called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
      operator_delete((void *)local_2b8._0_8_,local_2a8._0_8_ + 1);
    }
    return false;
  }
  pcVar14 = status->Makefile;
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,"CMAKE_PROJECT_INCLUDE_BEFORE","");
  local_98 = status;
  bVar2 = IncludeByVariable(status,(string *)local_2b8);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,local_2a8._0_8_ + 1);
  }
  if (!bVar2) {
    return false;
  }
  psVar25 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::operator+(&local_128,"CMAKE_PROJECT_",psVar25);
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
  local_2b8._0_8_ = local_2a8;
  pcVar13 = (pointer)(puVar7 + 2);
  if ((pointer)*puVar7 == pcVar13) {
    local_2a8._0_8_ = *(undefined8 *)pcVar13;
    local_2a8._8_8_ = puVar7[3];
  }
  else {
    local_2a8._0_8_ = *(undefined8 *)pcVar13;
    local_2b8._0_8_ = (pointer)*puVar7;
  }
  local_2b8._8_8_ = puVar7[1];
  *puVar7 = pcVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  bVar2 = IncludeByVariable(local_98,(string *)local_2b8);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    return false;
  }
  cmMakefile::SetProjectName(pcVar14,psVar25);
  local_2b8._0_8_ = local_2a8;
  pcVar13 = (psVar25->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b8,pcVar13,pcVar13 + psVar25->_M_string_length);
  std::__cxx11::string::append((char *)local_2b8);
  psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar14);
  cmMakefile::AddCacheDefinition
            (pcVar14,(string *)local_2b8,(psVar8->_M_dataplus)._M_p,"Value Computed by CMake",STATIC
             ,false);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  pcVar13 = (psVar25->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b8,pcVar13,pcVar13 + psVar25->_M_string_length);
  std::__cxx11::string::append((char *)local_2b8);
  psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar14);
  cmMakefile::AddCacheDefinition
            (pcVar14,(string *)local_2b8,(psVar8->_M_dataplus)._M_p,"Value Computed by CMake",STATIC
             ,false);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_BINARY_DIR","");
  psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar14);
  value._M_str = (psVar8->_M_dataplus)._M_p;
  value._M_len = psVar8->_M_string_length;
  cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_SOURCE_DIR","");
  psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar14);
  value_00._M_str = (psVar8->_M_dataplus)._M_p;
  value_00._M_len = psVar8->_M_string_length;
  cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value_00);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_NAME","");
  value_01._M_str = (psVar25->_M_dataplus)._M_p;
  value_01._M_len = psVar25->_M_string_length;
  cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value_01);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_IS_TOP_LEVEL","");
  bVar2 = cmMakefile::IsRootMakefile(pcVar14);
  cmMakefile::AddDefinitionBool(pcVar14,(string *)local_2b8,bVar2);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  pcVar13 = (psVar25->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b8,pcVar13,pcVar13 + psVar25->_M_string_length);
  std::__cxx11::string::append((char *)local_2b8);
  bVar2 = cmMakefile::IsRootMakefile(pcVar14);
  pcVar15 = "OFF";
  if (bVar2) {
    pcVar15 = "ON";
  }
  cmMakefile::AddCacheDefinition
            (pcVar14,(string *)local_2b8,pcVar15,"Value Computed by CMake",STATIC,false);
  if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
  }
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"CMAKE_PROJECT_NAME","");
  cVar9 = cmMakefile::GetDefinition(pcVar14,(string *)local_2b8);
  if (cVar9.Value == (string *)0x0) {
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
LAB_0033e431:
    local_2b8._0_8_ = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"CMAKE_PROJECT_NAME","");
    cmMakefile::RemoveDefinition(pcVar14,(string *)local_2b8);
    if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    local_2b8._0_8_ = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddCacheDefinition
              (pcVar14,(string *)local_2b8,(psVar25->_M_dataplus)._M_p,"Value Computed by CMake",
               STATIC,false);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
  }
  else {
    bVar2 = cmMakefile::IsRootMakefile(pcVar14);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    if (bVar2) goto LAB_0033e431;
  }
  local_50._M_allocated_capacity = (size_type)&local_40;
  bVar2 = false;
  local_50._8_8_ = 0;
  local_40._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_allocated_capacity = (size_type)&local_308;
  local_2f8 = (cmMakefile *)0x0;
  paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_308._M_unused._M_object = (cmMakefile *)0x0;
  local_308._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (pointer)0x0;
  local_310 = psVar25;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20) < 0x21) {
LAB_0033ecc5:
    PVar5 = cmMakefile::GetPolicyStatus(pcVar14,CMP0048,false);
    if (bVar2 == false) {
      if (PVar5 != OLD) {
        local_2b8._0_8_ = (cmMakefile *)local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_VERSION","");
        local_298[0] = &local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"PROJECT_VERSION_MAJOR","");
        local_278._M_allocated_capacity = (size_type)local_268;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"PROJECT_VERSION_MINOR","");
        local_258 = &local_248;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_268 + 0x10),"PROJECT_VERSION_PATCH","");
        local_248.field_2._M_allocated_capacity = (size_type)local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&local_248 + 0x10),"PROJECT_VERSION_TWEAK","");
        local_218._M_nxt = local_208;
        pcVar13 = (local_310->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,pcVar13,pcVar13 + local_310->_M_string_length);
        std::__cxx11::string::append((char *)&local_218);
        local_1f8 = local_1e8;
        pcVar13 = (local_310->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar13,pcVar13 + local_310->_M_string_length);
        std::__cxx11::string::append((char *)&local_1f8);
        local_1d8[0] = (_Base_ptr)local_1c8;
        pcVar13 = (local_310->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar13,pcVar13 + local_310->_M_string_length);
        std::__cxx11::string::append((char *)local_1d8);
        local_1b8 = (_Base_ptr)local_1a8;
        pcVar13 = (local_310->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar13,pcVar13 + local_310->_M_string_length);
        std::__cxx11::string::append((char *)&local_1b8);
        p_Var23 = (_Base_ptr)local_188;
        pcVar13 = (local_310->_M_dataplus)._M_p;
        local_198[0] = p_Var23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,pcVar13,pcVar13 + local_310->_M_string_length);
        std::__cxx11::string::append((char *)local_198);
        __l._M_len = 10;
        __l._M_array = (iterator)local_2b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338,__l,(allocator_type *)&local_128);
        lVar19 = -0x140;
        do {
          if (p_Var23 != p_Var23[-1]._M_left) {
            operator_delete(p_Var23[-1]._M_left,
                            (ulong)((long)&(((((__uniq_ptr_data<cmSourceFile,_std::default_delete<cmSourceFile>,_true,_true>
                                                *)&p_Var23->_M_color)->
                                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                             )._M_t.
                                             super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                             .super__Head_base<0UL,_cmSourceFile_*,_false>.
                                            _M_head_impl)->Location).Makefile + 1));
          }
          p_Var23 = p_Var23 + -1;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        bVar2 = cmMakefile::IsRootMakefile(pcVar14);
        if (bVar2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        }
        psVar25 = local_310;
        uVar10 = local_338._8_8_;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        local_128._M_string_length = 0;
        local_128.field_2._M_allocated_capacity =
             local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (local_338._0_8_ != local_338._8_8_) {
          psVar8 = (string *)local_338._0_8_;
          do {
            cVar9 = cmMakefile::GetDefinition(pcVar14,psVar8);
            id = extraout_EDX;
            if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
              if (PVar5 == WARN) {
                if (((ulong)local_a0 & 1) == 0) {
                  std::__cxx11::string::append((char *)&local_128);
                  std::__cxx11::string::_M_append
                            ((char *)&local_128,(ulong)(psVar8->_M_dataplus)._M_p);
                  id = extraout_EDX_00;
                }
              }
              else {
                cmMakefile::AddDefinition(pcVar14,psVar8,(string_view)(ZEXT816(0x744109) << 0x40));
                id = extraout_EDX_01;
              }
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != (string *)uVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_string_length !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            cmPolicies::GetPolicyWarning_abi_cxx11_
                      ((string *)(local_188 + 0x10),(cmPolicies *)0x30,id);
            local_2b8._0_8_ = local_170;
            local_2b8._8_8_ = local_188._16_8_;
            local_2a8._0_8_ = (cmMakefile *)0x31;
            local_2a8._8_8_ = "\nThe following variable(s) would be set to empty:";
            local_298[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_128._M_string_length;
            local_298[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_128._M_dataplus._M_p;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_2b8;
            cmCatViews_abi_cxx11_(&local_2e8,views_00);
            cmMakefile::IssueMessage(pcVar14,AUTHOR_WARNING,&local_2e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,
                              CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                       local_2e8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._16_8_ != &local_168) {
              operator_delete((void *)local_188._16_8_,
                              CONCAT71(local_168._M_allocated_capacity._1_7_,
                                       local_168._M_local_buf[0]) + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_338);
      }
    }
    else {
      if (PVar5 < NEW) {
        local_2b8._0_8_ = (cmMakefile *)local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,"VERSION not allowed unless CMP0048 is set to NEW","");
        cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,(string *)local_2b8);
        if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
LAB_0033ec9e:
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
        }
        goto LAB_0033ecae;
      }
      local_208[0]._M_nxt = (_Hash_node_base *)0x0;
      local_1f8 = (__node_base *)0x0;
      local_1f0 = 0;
      memset((RegularExpression *)local_2b8,0,0xaa);
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_2b8,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      uVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_2b8,(char *)local_50._M_allocated_capacity,
                         (RegularExpressionMatch *)local_2b8);
      if ((bool)uVar3) {
        PVar5 = cmMakefile::GetPolicyStatus(pcVar14,CMP0096,false);
        local_188._16_8_ = &local_168;
        local_170 = (cmMakefile *)0x0;
        local_168._M_local_buf[0] = '\0';
        lVar19 = 0x10;
        pbVar24 = &local_128;
        do {
          puVar16 = (undefined1 *)((long)&local_128._M_dataplus._M_p + lVar19);
          *(undefined1 **)
           ((long)&local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar19) = puVar16;
          *(undefined8 *)((long)&uStack_130 + lVar19) = 0;
          *puVar16 = 0;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0x90);
        local_158._8_8_ = CONCAT71(local_158._9_7_,uVar3);
        if (PVar5 < NEW) {
          local_338._0_8_ = (string *)0x0;
          local_338._8_8_ = (string *)0x0;
          iVar6 = __isoc99_sscanf(local_50._M_allocated_capacity,"%u.%u.%u.%u",local_338,
                                  local_338 + 4,local_338 + 8,local_338 + 0xc);
          psVar8 = &local_2e8;
          lVar19 = 0;
          do {
            if (lVar19 < iVar6) {
              snprintf((char *)psVar8,0xb,"%u",(ulong)*(uint *)(local_338 + lVar19 * 4));
              std::__cxx11::string::append(local_188 + 0x10);
              std::__cxx11::string::append(local_188 + 0x10);
              pcVar15 = (char *)pbVar24->_M_string_length;
              strlen((char *)psVar8);
              std::__cxx11::string::_M_replace((ulong)pbVar24,0,pcVar15,(ulong)psVar8);
            }
            else {
              *(undefined1 *)&(psVar8->_M_dataplus)._M_p = 0;
            }
            lVar19 = lVar19 + 1;
            pbVar24 = pbVar24 + 1;
            psVar8 = (string *)((long)&psVar8->_M_string_length + 3);
            psVar25 = local_310;
          } while (lVar19 != 4);
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)(local_188 + 0x10),(string *)local_50._M_local_buf);
          cmsys::SystemTools::SplitString
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2e8,(string *)(local_188 + 0x10),'.',false);
          psVar25 = local_310;
          if ((pointer)local_2e8._M_string_length != local_2e8._M_dataplus._M_p) {
            uVar22 = 0;
            uVar17 = 1;
            do {
              std::__cxx11::string::operator=
                        ((string *)(&local_128 + uVar22),
                         (string *)(local_2e8._M_dataplus._M_p + uVar22 * 0x20));
              bVar2 = uVar17 < (ulong)((long)(local_2e8._M_string_length -
                                             (long)local_2e8._M_dataplus._M_p) >> 5);
              uVar22 = uVar17;
              uVar17 = (ulong)((int)uVar17 + 1);
            } while (bVar2);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2e8);
        }
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_local_buf[0] = '\0';
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,psVar25,"_VERSION");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        psVar8 = (string *)(local_338 + 0x10);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"PROJECT_VERSION","");
        value_02._M_str = (char *)local_188._16_8_;
        value_02._M_len = (size_t)local_170;
        cmMakefile::AddDefinition(pcVar14,(string *)local_338,value_02);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_03._M_str = (char *)local_188._16_8_;
        value_03._M_len = (size_t)local_170;
        cmMakefile::AddDefinition(pcVar14,&local_2e8,value_03);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,psVar25,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_MAJOR","");
        value_04._M_str = local_128._M_dataplus._M_p;
        value_04._M_len = local_128._M_string_length;
        cmMakefile::AddDefinition(pcVar14,(string *)local_338,value_04);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_05._M_str = local_128._M_dataplus._M_p;
        value_05._M_len = local_128._M_string_length;
        cmMakefile::AddDefinition(pcVar14,&local_2e8,value_05);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,psVar25,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_MINOR","");
        value_06._M_str = local_108._M_dataplus._M_p;
        value_06._M_len = local_108._M_string_length;
        cmMakefile::AddDefinition(pcVar14,(string *)local_338,value_06);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_07._M_str = local_108._M_dataplus._M_p;
        value_07._M_len = local_108._M_string_length;
        cmMakefile::AddDefinition(pcVar14,&local_2e8,value_07);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,psVar25,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_PATCH","");
        value_08._M_str = local_e8._M_dataplus._M_p;
        value_08._M_len = local_e8._M_string_length;
        cmMakefile::AddDefinition(pcVar14,(string *)local_338,value_08);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_09._M_str = local_e8._M_dataplus._M_p;
        value_09._M_len = local_e8._M_string_length;
        cmMakefile::AddDefinition(pcVar14,&local_2e8,value_09);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,psVar25,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_TWEAK","");
        value_10._M_str = local_c8._M_dataplus._M_p;
        value_10._M_len = local_c8._M_string_length;
        cmMakefile::AddDefinition(pcVar14,(string *)local_338,value_10);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_11._M_str = local_c8._M_dataplus._M_p;
        value_11._M_len = local_c8._M_string_length;
        cmMakefile::AddDefinition(pcVar14,&local_2e8,value_11);
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION","");
        TopLevelCMakeVarCondSet(pcVar14,(string *)local_338,(string *)(local_188 + 0x10));
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_MAJOR","");
        TopLevelCMakeVarCondSet(pcVar14,(string *)local_338,&local_128);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_MINOR","");
        TopLevelCMakeVarCondSet(pcVar14,(string *)local_338,&local_108);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_PATCH","");
        TopLevelCMakeVarCondSet(pcVar14,(string *)local_338,&local_e8);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_TWEAK","");
        TopLevelCMakeVarCondSet(pcVar14,(string *)local_338,&local_c8);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
        lVar19 = -0x80;
        paVar18 = &local_c8.field_2;
        uVar3 = local_158._M_local_buf[8];
        do {
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar18->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                            paVar18->_M_allocated_capacity + 1);
          }
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar18->_M_allocated_capacity + -4);
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._16_8_ != &local_168) {
          uVar10 = CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]);
          _Var21._M_p = (pointer)local_188._16_8_;
LAB_0033f9cb:
          operator_delete(_Var21._M_p,uVar10 + 1);
        }
      }
      else {
        std::operator+(&local_2e8,"VERSION \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 == paVar18) {
          local_128.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_128.field_2._8_8_ = plVar12[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_128._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_128._M_string_length = plVar12[1];
        *plVar12 = (long)paVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
        cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,&local_128);
        cmSystemTools::s_FatalErrorOccurred = true;
        uVar10 = local_128.field_2._M_allocated_capacity;
        _Var21._M_p = local_128._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) goto LAB_0033f9cb;
      }
      psVar25 = local_310;
      if (local_1f8 != (__node_base *)0x0) {
        operator_delete__(local_1f8);
      }
      bVar2 = true;
      if (uVar3 == '\0') goto LAB_0033fe19;
    }
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_DESCRIPTION","");
    value_12._M_str = local_70._M_dataplus._M_p;
    value_12._M_len = local_70._M_string_length;
    cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value_12);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    pcVar13 = (psVar25->_M_dataplus)._M_p;
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,pcVar13,pcVar13 + psVar25->_M_string_length);
    std::__cxx11::string::append(local_2b8);
    value_13._M_str = local_70._M_dataplus._M_p;
    value_13._M_len = local_70._M_string_length;
    cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value_13);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,"CMAKE_PROJECT_DESCRIPTION","");
    TopLevelCMakeVarCondSet(pcVar14,(string *)local_2b8,&local_70);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"PROJECT_HOMEPAGE_URL","");
    value_14._M_str = local_90._M_dataplus._M_p;
    value_14._M_len = local_90._M_string_length;
    cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value_14);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    pcVar13 = (psVar25->_M_dataplus)._M_p;
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,pcVar13,pcVar13 + psVar25->_M_string_length);
    std::__cxx11::string::append(local_2b8);
    value_15._M_str = local_90._M_dataplus._M_p;
    value_15._M_len = local_90._M_string_length;
    cmMakefile::AddDefinition(pcVar14,(string *)local_2b8,value_15);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,"CMAKE_PROJECT_HOMEPAGE_URL","");
    TopLevelCMakeVarCondSet(pcVar14,(string *)local_2b8,&local_90);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_2b8._0_8_ = (cmMakefile *)local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"C","");
      paVar18 = &local_288;
      local_298[0] = paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CXX","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                 local_2b8,&local_278);
      lVar19 = -0x40;
      do {
        if (paVar18 !=
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(paVar18->_M_local_buf + -0x10)) {
          operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            **)(paVar18->_M_local_buf + -0x10),paVar18->_M_allocated_capacity + 1);
        }
        paVar18 = paVar18 + -2;
        lVar19 = lVar19 + 0x20;
        psVar25 = local_310;
      } while (lVar19 != 0);
    }
    cmMakefile::EnableLanguage(pcVar14,&local_148,false);
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"CMAKE_PROJECT_INCLUDE","");
    bVar2 = IncludeByVariable(local_98,(string *)local_2b8);
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
    }
    if (bVar2) {
      std::operator+(&local_128,"CMAKE_PROJECT_",psVar25);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
      pcVar14 = (cmMakefile *)(puVar7 + 2);
      if ((cmMakefile *)*puVar7 == pcVar14) {
        local_2a8._0_8_ =
             (pcVar14->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map;
        local_2a8._8_8_ = puVar7[3];
        local_2b8._0_8_ = (cmMakefile *)local_2a8;
      }
      else {
        local_2a8._0_8_ =
             (pcVar14->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map;
        local_2b8._0_8_ = (cmMakefile *)*puVar7;
      }
      local_2b8._8_8_ = puVar7[1];
      *puVar7 = pcVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      bVar2 = IncludeByVariable(local_98,(string *)local_2b8);
      if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    iVar6 = 2;
    lVar19 = 0x20;
    bVar2 = false;
    bVar1 = false;
    local_158._8_8_ = 0;
    local_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    uVar22 = 1;
    do {
      iVar4 = std::__cxx11::string::compare((char *)((long)&(pbVar20->_M_dataplus)._M_p + lVar19));
      if (iVar4 == 0) {
        if (bVar1) {
          local_2b8._0_8_ = local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"LANGUAGES may be specified at most once.","");
          cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,(string *)local_2b8);
          goto LAB_0033ec91;
        }
        if (local_2f8 != (cmMakefile *)0x0) {
          (*(code *)paStack_2f0)(&local_308);
        }
        bVar1 = true;
        iVar6 = 2;
        if (local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          separator._M_str = ", ";
          separator._M_len = 2;
          cmJoin((string *)(local_188 + 0x10),&local_148,separator,(string_view)ZEXT816(0));
          local_2b8._0_8_ = &DAT_00000044;
          local_2b8._8_8_ = "the following parameters must be specified after LANGUAGES keyword: ";
          local_2a8._0_8_ = local_170;
          local_2a8._8_8_ = local_188._16_8_;
          local_128._M_dataplus._M_p = (pointer)0x1;
          local_298[1] = &local_128.field_2;
          local_128.field_2._M_local_buf[0] = 0x2e;
          local_298[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
          views._M_len = 3;
          views._M_array = (iterator)local_2b8;
          local_128._M_string_length = (size_type)local_298[1];
          cmCatViews_abi_cxx11_(&local_2e8,views);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._16_8_ != &local_168) {
            operator_delete((void *)local_188._16_8_,
                            CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]
                                    ) + 1);
          }
          cmMakefile::IssueMessage(pcVar14,WARNING,&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,
                            CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                     local_2e8.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar19));
        if (iVar4 == 0) {
          if (bVar2) {
            local_2b8._0_8_ = local_2a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"VERSION may be specified at most once.","");
            cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,(string *)local_2b8);
            goto LAB_0033ec91;
          }
          if (local_2f8 == (cmMakefile *)0x0) {
            local_2a8._0_8_ = (cmMakefile *)0x0;
          }
          else {
            (*(code *)paStack_2f0)(&local_308);
            local_2a8._0_8_ = local_2f8;
          }
          local_2b8._0_8_ = local_308._M_unused._M_object;
          local_2b8._8_8_ = local_308._8_8_;
          local_308._8_8_ = &local_158;
          local_2f8 = (cmMakefile *)
                      std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:132:29)>
                      ::_M_manager;
          local_2a8._8_8_ = paStack_2f0;
          paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:132:29)>
                           ::_M_invoke;
          local_308._M_unused._0_8_ = pcVar14;
          if ((cmMakefile *)local_2a8._0_8_ != (cmMakefile *)0x0) {
            (*(code *)local_2a8._0_8_)(local_2b8,local_2b8,3);
          }
          bVar2 = true;
          iVar6 = 3;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar19));
          if (iVar4 == 0) {
            if ((local_158._8_8_ & 1) != 0) {
              local_2b8._0_8_ = local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,"DESCRIPTION may be specified at most once.","");
              cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,(string *)local_2b8);
              goto LAB_0033ec91;
            }
            if (local_2f8 == (cmMakefile *)0x0) {
              pcVar11 = (cmMakefile *)0x0;
            }
            else {
              (*(code *)paStack_2f0)(&local_308);
              pcVar11 = local_2f8;
            }
            local_2b8._0_8_ = local_308._M_unused._M_object;
            local_2b8._8_8_ = local_308._8_8_;
            local_308._8_8_ = &local_158;
            local_2f8 = (cmMakefile *)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:151:29)>
                        ::_M_manager;
            local_2a8._8_8_ = paStack_2f0;
            paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:151:29)>
                             ::_M_invoke;
            local_308._M_unused._0_8_ = pcVar14;
            local_2a8._0_8_ = pcVar11;
            if (pcVar11 != (cmMakefile *)0x0) {
              pcVar11 = (cmMakefile *)(*(code *)pcVar11)(local_2b8,local_2b8,3);
            }
            local_158._8_8_ = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
            iVar6 = 0;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar19));
            pcVar11 = local_2f8;
            if (iVar4 == 0) {
              if (((ulong)local_a8 & 1) != 0) {
                local_2b8._0_8_ = local_2a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b8,"HOMEPAGE_URL may be specified at most once.","");
                cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,(string *)local_2b8);
                goto LAB_0033ec91;
              }
              local_2b8._0_8_ = local_308._M_unused._M_object;
              local_2b8._8_8_ = local_308._8_8_;
              local_308._8_8_ = &local_158;
              local_2a8._0_8_ = local_2f8;
              local_2f8 = (cmMakefile *)
                          std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:167:29)>
                          ::_M_manager;
              local_2a8._8_8_ = paStack_2f0;
              paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:167:29)>
                               ::_M_invoke;
              local_308._M_unused._0_8_ = pcVar14;
              if (pcVar11 != (cmMakefile *)0x0) {
                pcVar11 = (cmMakefile *)(*(code *)pcVar11)(local_2b8,local_2b8,3);
              }
              local_a8 = (pointer)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
              iVar6 = 1;
            }
            else if ((uVar22 == 1) &&
                    (uVar10 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1)),
                    (int)uVar10 == 0)) {
              local_a0 = (pointer)CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            else {
              if (iVar6 == 0) {
                std::__cxx11::string::_M_assign((string *)&local_70);
                local_2a8._0_8_ = (cmMakefile *)0x0;
                local_2a8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_2b8._0_8_ = (cmMakefile *)0x0;
                local_2b8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_158._M_allocated_capacity,
                           (function<void_()> *)local_2b8);
                if ((cmMakefile *)local_2a8._0_8_ != (cmMakefile *)0x0) {
                  (*(code *)local_2a8._0_8_)
                            ((function<void_()> *)local_2b8,(function<void_()> *)local_2b8,3);
                }
              }
              else if (iVar6 == 1) {
                std::__cxx11::string::_M_assign((string *)&local_90);
                local_2a8._0_8_ = (cmMakefile *)0x0;
                local_2a8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_2b8._0_8_ = (cmMakefile *)0x0;
                local_2b8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_158._M_allocated_capacity,
                           (function<void_()> *)local_2b8);
                if ((cmMakefile *)local_2a8._0_8_ != (cmMakefile *)0x0) {
                  (*(code *)local_2a8._0_8_)
                            ((function<void_()> *)local_2b8,(function<void_()> *)local_2b8,3);
                }
              }
              else {
                if (iVar6 != 3) {
                  iVar6 = 2;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_148,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar19));
                  goto LAB_0033eab2;
                }
                std::__cxx11::string::_M_assign((string *)local_50._M_local_buf);
                local_2a8._0_8_ = (cmMakefile *)0x0;
                local_2a8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_2b8._0_8_ = (cmMakefile *)0x0;
                local_2b8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_158._M_allocated_capacity,
                           (function<void_()> *)local_2b8);
                if ((cmMakefile *)local_2a8._0_8_ != (cmMakefile *)0x0) {
                  (*(code *)local_2a8._0_8_)
                            ((function<void_()> *)local_2b8,(function<void_()> *)local_2b8,3);
                }
              }
              iVar6 = 2;
            }
          }
        }
      }
LAB_0033eab2:
      psVar25 = local_310;
      uVar22 = uVar22 + 1;
      pbVar20 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0x20;
    } while (uVar22 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5
                             ));
    if (local_2f8 != (cmMakefile *)0x0) {
      (*(code *)paStack_2f0)(&local_308);
    }
    if ((((byte)local_158._8_8_ | bVar2 | (byte)local_a8) & 1) == 0) {
      bVar2 = false;
      if (bVar1) goto LAB_0033eb65;
      goto LAB_0033ecc5;
    }
    if (bVar1) {
LAB_0033eb65:
      if (local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[5]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                   (char (*) [5])0x72f004);
      }
      goto LAB_0033ecc5;
    }
    psVar25 = local_310;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0033ecc5;
    local_2b8._0_8_ = (cmMakefile *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,"");
    cmMakefile::IssueMessage(pcVar14,FATAL_ERROR,(string *)local_2b8);
LAB_0033ec91:
    if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)local_2a8) goto LAB_0033ec9e;
LAB_0033ecae:
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar2 = true;
  }
LAB_0033fe19:
  if (local_2f8 != (cmMakefile *)0x0) {
    (*(code *)local_2f8)(&local_308,&local_308,3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool cmProjectCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE_BEFORE")) {
    return false;
  }

  mf.SetProjectName(projectName);

  mf.AddCacheDefinition(projectName + "_BINARY_DIR",
                        mf.GetCurrentBinaryDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);
  mf.AddCacheDefinition(projectName + "_SOURCE_DIR",
                        mf.GetCurrentSourceDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);

  mf.AddDefinition("PROJECT_BINARY_DIR", mf.GetCurrentBinaryDirectory());
  mf.AddDefinition("PROJECT_SOURCE_DIR", mf.GetCurrentSourceDirectory());

  mf.AddDefinition("PROJECT_NAME", projectName);

  mf.AddDefinitionBool("PROJECT_IS_TOP_LEVEL", mf.IsRootMakefile());
  mf.AddCacheDefinition(projectName + "_IS_TOP_LEVEL",
                        mf.IsRootMakefile() ? "ON" : "OFF",
                        "Value Computed by CMake", cmStateEnums::STATIC);

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!mf.GetDefinition("CMAKE_PROJECT_NAME") || mf.IsRootMakefile()) {
    mf.RemoveDefinition("CMAKE_PROJECT_NAME");
    mf.AddCacheDefinition("CMAKE_PROJECT_NAME", projectName,
                          "Value Computed by CMake", cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg = cmStrCat(
          "the following parameters must be specified after LANGUAGES "
          "keyword: ",
          cmJoin(languages, ", "), '.');
        mf.IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
                    "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus const cmp0048 =
    mf.GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      mf.IssueMessage(MessageType::FATAL_ERROR,
                      "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = R"(VERSION ")" + version + R"(" format invalid.)";
      mf.IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmPolicies::PolicyStatus const cmp0096 =
      mf.GetPolicyStatus(cmPolicies::CMP0096);

    constexpr std::size_t MAX_VERSION_COMPONENTS = 4u;
    std::string version_string;
    std::array<std::string, MAX_VERSION_COMPONENTS> version_components;

    if (cmp0096 == cmPolicies::OLD || cmp0096 == cmPolicies::WARN) {
      constexpr size_t maxIntLength =
        std::numeric_limits<unsigned>::digits10 + 2;
      char vb[MAX_VERSION_COMPONENTS][maxIntLength];
      unsigned v[MAX_VERSION_COMPONENTS] = { 0, 0, 0, 0 };
      const int vc = std::sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1],
                                 &v[2], &v[3]);
      for (auto i = 0u; i < MAX_VERSION_COMPONENTS; ++i) {
        if (static_cast<int>(i) < vc) {
          std::snprintf(vb[i], maxIntLength, "%u", v[i]);
          version_string += &"."[static_cast<std::size_t>(i == 0)];
          version_string += vb[i];
          version_components[i] = vb[i];
        } else {
          vb[i][0] = '\x00';
        }
      }
    } else {
      // The regex above verified that we have a .-separated string of
      // non-negative integer components.  Keep the original string.
      version_string = std::move(version);
      // Split the integer components.
      auto components = cmSystemTools::SplitString(version_string, '.');
      for (auto i = 0u; i < components.size(); ++i) {
        version_components[i] = std::move(components[i]);
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    mf.AddDefinition("PROJECT_VERSION", version_string);
    mf.AddDefinition(vv, version_string);
    vv = projectName + "_VERSION_MAJOR";
    mf.AddDefinition("PROJECT_VERSION_MAJOR", version_components[0]);
    mf.AddDefinition(vv, version_components[0]);
    vv = projectName + "_VERSION_MINOR";
    mf.AddDefinition("PROJECT_VERSION_MINOR", version_components[1]);
    mf.AddDefinition(vv, version_components[1]);
    vv = projectName + "_VERSION_PATCH";
    mf.AddDefinition("PROJECT_VERSION_PATCH", version_components[2]);
    mf.AddDefinition(vv, version_components[2]);
    vv = projectName + "_VERSION_TWEAK";
    mf.AddDefinition("PROJECT_VERSION_TWEAK", version_components[3]);
    mf.AddDefinition(vv, version_components[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION", version_string);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MAJOR",
                            version_components[0]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MINOR",
                            version_components[1]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_PATCH",
                            version_components[2]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_TWEAK",
                            version_components[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv = { "PROJECT_VERSION",
                                    "PROJECT_VERSION_MAJOR",
                                    "PROJECT_VERSION_MINOR",
                                    "PROJECT_VERSION_PATCH",
                                    "PROJECT_VERSION_TWEAK",
                                    projectName + "_VERSION",
                                    projectName + "_VERSION_MAJOR",
                                    projectName + "_VERSION_MINOR",
                                    projectName + "_VERSION_PATCH",
                                    projectName + "_VERSION_TWEAK" };
    if (mf.IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      cmValue v = mf.GetDefinition(i);
      if (cmNonempty(v)) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          mf.AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0048),
                 "\nThe following variable(s) would be set to empty:", vw));
    }
  }

  mf.AddDefinition("PROJECT_DESCRIPTION", description);
  mf.AddDefinition(projectName + "_DESCRIPTION", description);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_DESCRIPTION", description);

  mf.AddDefinition("PROJECT_HOMEPAGE_URL", homepage);
  mf.AddDefinition(projectName + "_HOMEPAGE_URL", homepage);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_HOMEPAGE_URL", homepage);

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages = { "C", "CXX" };
  }
  mf.EnableLanguage(languages, false);

  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}